

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall FHealthBar::SetVial(FHealthBar *this,int level)

{
  int local_14;
  int level_local;
  FHealthBar *this_local;
  
  if (level < 0) {
    local_14 = 0;
  }
  else {
    local_14 = level;
    if ((200 < level) && (level != 999)) {
      local_14 = 200;
    }
  }
  if (this->VialLevel != local_14) {
    this->VialLevel = local_14;
    this->NeedRefresh = true;
  }
  return;
}

Assistant:

void FHealthBar::SetVial (int level)
{
	if (level < 0)
	{
		level = 0;
	}
	else if (level > 200 && level != 999)
	{
		level = 200;
	}
	if (VialLevel != level)
	{
		VialLevel = level;
		NeedRefresh = true;
	}
}